

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

void free_chain(ip_chain_t *ipc)

{
  list_head *plVar1;
  list_head *__mptr_2;
  list_head *__mptr_1;
  list_head *__mptr;
  ip_rule_t *q;
  ip_rule_t *p;
  ip_chain_t *ipc_local;
  
  if (ipc != (ip_chain_t *)0x0) {
    list_del(&ipc->list);
    plVar1 = (ipc->rules).next;
    q = (ip_rule_t *)(plVar1 + -5);
    plVar1 = plVar1->next;
    while (__mptr = plVar1 + -5, &q->list != &ipc->rules) {
      free_rule(q);
      q = (ip_rule_t *)__mptr;
      plVar1 = plVar1->next;
    }
    if (ipc != (ip_chain_t *)0x0) {
      mwFree(ipc,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
             0x67);
    }
  }
  return;
}

Assistant:

static void free_chain(ip_chain_t *ipc)
{
	if (ipc == NULL) {
		return;
	}

	list_del(&ipc->list);

	ip_rule_t *p = NULL, *q = NULL;

	list_for_each_entry_safe(p, q, &ipc->rules, list) {
		free_rule(p);
	}


	_free(ipc);
}